

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferOperations.cpp
# Opt level: O0

string * __thiscall
glcts::TextureBufferOperationsViaFrambufferReadBack::getFBFragmentShaderCode_abi_cxx11_
          (string *__return_storage_ptr__,TextureBufferOperationsViaFrambufferReadBack *this)

{
  stringstream local_1a0 [8];
  stringstream strstream;
  ostream local_190;
  TextureBufferOperationsViaFrambufferReadBack *local_18;
  TextureBufferOperationsViaFrambufferReadBack *this_local;
  
  local_18 = this;
  this_local = (TextureBufferOperationsViaFrambufferReadBack *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::operator<<(&local_190,
                  "${VERSION}\n\nprecision highp float;\n\nout ivec4 color;\n\nvoid main(void)\n{\n    color = ivec4(0, 1, 0, 1);\n}\n"
                 );
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string TextureBufferOperationsViaFrambufferReadBack::getFBFragmentShaderCode() const
{
	std::stringstream strstream;

	strstream << "${VERSION}\n"
				 "\n"
				 "precision highp float;\n"
				 "\n"
				 "out ivec4 color;\n"
				 "\n"
				 "void main(void)\n"
				 "{\n"
				 "    color = ivec4(0, 1, 0, 1);\n"
				 "}\n";

	return strstream.str();
}